

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall DatabaseConfig::get_all_abi_cxx11_(DatabaseConfig *this)

{
  bool bVar1;
  iterator this_00;
  reference this_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  ConfigKey *key;
  iterator __end1;
  iterator __begin1;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *result;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  in_stack_ffffffffffffff58;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_> local_50 [3];
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x16246e);
  ConfigKey::available();
  local_20 = local_38;
  local_50[0]._M_current =
       (ConfigKey *)
       std::vector<ConfigKey,_std::allocator<ConfigKey>_>::begin(in_stack_ffffffffffffff48);
  this_00 = std::vector<ConfigKey,_std::allocator<ConfigKey>_>::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                            (__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>::
              operator*(local_50);
    ConfigKey::key_abi_cxx11_(this_01);
    in_stack_ffffffffffffff60 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)get((DatabaseConfig *)this_00._M_current,this_01);
    pVar2 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<std::__cxx11::string_const&,unsigned_long>
                      (in_stack_ffffffffffffff60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff58._M_cur,
                       (unsigned_long *)
                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff58._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    in_stack_ffffffffffffff57 = pVar2.second;
    __gnu_cxx::__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>::
    operator++(local_50);
  }
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector
            ((vector<ConfigKey,_std::allocator<ConfigKey>_> *)in_stack_ffffffffffffff60);
  return in_RDI;
}

Assistant:

std::unordered_map<std::string, uint64_t> DatabaseConfig::get_all() const {
    std::unordered_map<std::string, uint64_t> result;
    for (const auto &key : ConfigKey::available()) {
        result.emplace(key.key(), get(key));
    }
    return result;
}